

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_22460c::BNTest_Rand_Test::TestBody(BNTest_Rand_Test *this)

{
  bool bVar1;
  int iVar2;
  BIGNUM *pBVar3;
  char *pcVar4;
  char *in_R9;
  bool local_311;
  bool local_305;
  AssertHelper local_2e0;
  Message local_2d8;
  bool local_2c9;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_6;
  Message local_2b0;
  bool local_2a1;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_5;
  Message local_288;
  bool local_279;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_4;
  Message local_260;
  bool local_251;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_3;
  Message local_238;
  bool local_229;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_2;
  Message local_210;
  bool local_201;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1d0;
  Message local_1c8;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_190;
  Message local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_150;
  Message local_148;
  undefined1 local_140 [8];
  AssertionResult gtest_ar__2;
  Message local_128;
  uint local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar;
  AssertHelper local_e8;
  Message local_e0;
  int local_d4;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__1;
  int i;
  bool seen_0_set;
  bool seen_0_clear;
  int iStack_b4;
  bool seen_n_2_set;
  bool seen_n_2_clear;
  bool seen_n_1_set;
  bool seen_n_1_clear;
  ScopedTrace gtest_trace_1297;
  int bottom;
  int *__end3;
  int *__begin3;
  int (*__range3) [2];
  ScopedTrace gtest_trace_1295;
  int *piStack_90;
  int top;
  int *__end2;
  int *__begin2;
  int (*__range2) [3];
  uint local_70;
  uint uStack_6c;
  ScopedTrace gtest_trace_1293;
  uint bits;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<BIGNUM> bn;
  BNTest_Rand_Test *this_local;
  
  pBVar3 = BN_new();
  std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&gtest_ar_.message_,(pointer)pBVar3);
  testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&bits,(internal *)local_28,(AssertionResult *)0x84bde6,"false","true",in_R9
              );
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x508,pcVar4);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&bits);
    testing::Message::~Message(local_40);
  }
  uStack_6c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (uStack_6c == 0) {
    for (local_70 = 0; local_70 < 0x100; local_70 = local_70 + 1) {
      testing::ScopedTrace::ScopedTrace<unsigned_int>
                ((ScopedTrace *)((long)&__range2 + 7),
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x50d,&local_70);
      piStack_90 = TestBody::kBottom;
      for (__end2 = TestBody::kTop; __end2 != piStack_90; __end2 = __end2 + 1) {
        __range3._4_4_ = *__end2;
        testing::ScopedTrace::ScopedTrace<int>
                  ((ScopedTrace *)((long)&__range3 + 3),
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x50f,(int *)((long)&__range3 + 4));
        _seen_n_2_clear =
             "N7testing8internal15TestFactoryImplIN12_GLOBAL__N_121BNTest_RandRange_TestEEE";
        for (__end3 = TestBody::kBottom; __end3 != (int *)_seen_n_2_clear; __end3 = __end3 + 1) {
          iStack_b4 = *__end3;
          testing::ScopedTrace::ScopedTrace<int>
                    ((ScopedTrace *)((long)&i + 3),
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x511,&stack0xffffffffffffff4c);
          i._2_1_ = 0;
          i._1_1_ = 0;
          i._0_1_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._7_1_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._6_1_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_1_ = 0;
          for (gtest_ar__1.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_4_ = 0;
              (int)gtest_ar__1.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl < 100;
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_4_ =
                   (int)gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl + 1) {
            pBVar3 = (BIGNUM *)
                     std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            local_d4 = BN_rand(pBVar3,local_70,__range3._4_4_,iStack_b4);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_d0,&local_d4,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
            if (!bVar1) {
              testing::Message::Message(&local_e0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar.message_,(internal *)local_d0,
                         (AssertionResult *)"BN_rand(bn.get(), bits, top, bottom)","false","true",
                         in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_e8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x51a,pcVar4);
              testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
              testing::internal::AssertHelper::~AssertHelper(&local_e8);
              std::__cxx11::string::~string((string *)&gtest_ar.message_);
              testing::Message::~Message(&local_e0);
            }
            uStack_6c = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
            if (uStack_6c != 0) goto LAB_003c67e8;
            pBVar3 = (BIGNUM *)
                     std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            local_11c = BN_num_bits(pBVar3);
            testing::internal::CmpHelperLE<unsigned_int,unsigned_int>
                      ((internal *)local_118,"BN_num_bits(bn.get())","bits",&local_11c,&local_70);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
            if (!bVar1) {
              testing::Message::Message(&local_128);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x51b,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__2.message_,&local_128);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
              testing::Message::~Message(&local_128);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
            pBVar3 = (BIGNUM *)
                     std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            iVar2 = BN_is_bit_set(pBVar3,local_70 - 1);
            if (iVar2 == 0) {
              i._2_1_ = 1;
            }
            else {
              i._1_1_ = 1;
            }
            pBVar3 = (BIGNUM *)
                     std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            iVar2 = BN_is_bit_set(pBVar3,local_70 - 2);
            if (iVar2 == 0) {
              i._0_1_ = 1;
            }
            else {
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._7_1_ = 1;
            }
            pBVar3 = (BIGNUM *)
                     std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            iVar2 = BN_is_bit_set(pBVar3,0);
            if (iVar2 == 0) {
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._6_1_ = 1;
            }
            else {
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_1_ = 1;
            }
          }
          if (local_70 != 0) {
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_140,
                       (bool *)((long)&gtest_ar__1.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               + 5),(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
            if (!bVar1) {
              testing::Message::Message(&local_148);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__3.message_,(internal *)local_140,
                         (AssertionResult *)"seen_0_set","false","true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_150,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x52e,pcVar4);
              testing::internal::AssertHelper::operator=(&local_150,&local_148);
              testing::internal::AssertHelper::~AssertHelper(&local_150);
              std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
              testing::Message::~Message(&local_148);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_180,(bool *)((long)&i + 1),(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
            if (!bVar1) {
              testing::Message::Message(&local_188);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__4.message_,(internal *)local_180,
                         (AssertionResult *)"seen_n_1_set","false","true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_190,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x52f,pcVar4);
              testing::internal::AssertHelper::operator=(&local_190,&local_188);
              testing::internal::AssertHelper::~AssertHelper(&local_190);
              std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
              testing::Message::~Message(&local_188);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
            if (1 < local_70) {
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_1c0,
                         (bool *)((long)&gtest_ar__1.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 + 7),(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
              if (!bVar1) {
                testing::Message::Message(&local_1c8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1.message_,(internal *)local_1c0,
                           (AssertionResult *)"seen_n_2_set","false","true",in_R9);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_1d0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x531,pcVar4);
                testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
                testing::internal::AssertHelper::~AssertHelper(&local_1d0);
                std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
                testing::Message::~Message(&local_1c8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
            }
          }
          if (local_70 != 0) {
            if (local_70 == 1) {
              local_305 = iStack_b4 == 0 && __range3._4_4_ == -1;
              local_201 = local_305;
              testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                        ((EqHelper *)local_200,"bottom == 0 && top == (-1)","seen_0_clear",
                         &local_201,
                         (bool *)((long)&gtest_ar__1.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 + 6));
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
              if (!bVar1) {
                testing::Message::Message(&local_210);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x53b,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_2.message_,&local_210);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_)
                ;
                testing::Message::~Message(&local_210);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
            }
            else if (local_70 == 2) {
              local_311 = iStack_b4 == 0 && __range3._4_4_ != 1;
              local_229 = local_311;
              testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                        ((EqHelper *)local_228,"bottom == 0 && top != 1","seen_0_clear",&local_229,
                         (bool *)((long)&gtest_ar__1.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 + 6));
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
              if (!bVar1) {
                testing::Message::Message(&local_238);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x53f,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_3.message_,&local_238);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_)
                ;
                testing::Message::~Message(&local_238);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
              local_251 = __range3._4_4_ == -1;
              testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                        ((EqHelper *)local_250,"top == (-1)","seen_n_1_clear",&local_251,
                         (bool *)((long)&i + 2));
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
              if (!bVar1) {
                testing::Message::Message(&local_260);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x540,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_4.message_,&local_260);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_)
                ;
                testing::Message::~Message(&local_260);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
            }
            else {
              local_279 = iStack_b4 == 0;
              testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                        ((EqHelper *)local_278,"bottom == 0","seen_0_clear",&local_279,
                         (bool *)((long)&gtest_ar__1.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 + 6));
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
              if (!bVar1) {
                testing::Message::Message(&local_288);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x542,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_5.message_,&local_288);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_)
                ;
                testing::Message::~Message(&local_288);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
              local_2a1 = __range3._4_4_ != 1;
              testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                        ((EqHelper *)local_2a0,"top != 1","seen_n_2_clear",&local_2a1,(bool *)&i);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
              if (!bVar1) {
                testing::Message::Message(&local_2b0);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x543,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_6.message_,&local_2b0);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_)
                ;
                testing::Message::~Message(&local_2b0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
              local_2c9 = __range3._4_4_ == -1;
              testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                        ((EqHelper *)local_2c8,"top == (-1)","seen_n_1_clear",&local_2c9,
                         (bool *)((long)&i + 2));
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
              if (!bVar1) {
                testing::Message::Message(&local_2d8);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
                testing::internal::AssertHelper::AssertHelper
                          (&local_2e0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x544,pcVar4);
                testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
                testing::internal::AssertHelper::~AssertHelper(&local_2e0);
                testing::Message::~Message(&local_2d8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
            }
          }
          uStack_6c = 0;
LAB_003c67e8:
          testing::ScopedTrace::~ScopedTrace((ScopedTrace *)((long)&i + 3));
          if (uStack_6c != 0) goto LAB_003c682b;
        }
        uStack_6c = 0;
LAB_003c682b:
        testing::ScopedTrace::~ScopedTrace((ScopedTrace *)((long)&__range3 + 3));
        if (uStack_6c != 0) goto LAB_003c6868;
      }
      uStack_6c = 0;
LAB_003c6868:
      testing::ScopedTrace::~ScopedTrace((ScopedTrace *)((long)&__range2 + 7));
      if (uStack_6c != 0) goto LAB_003c689c;
    }
    uStack_6c = 0;
  }
LAB_003c689c:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(BNTest, Rand) {
  bssl::UniquePtr<BIGNUM> bn(BN_new());
  ASSERT_TRUE(bn);

  static const int kTop[] = {BN_RAND_TOP_ANY, BN_RAND_TOP_ONE, BN_RAND_TOP_TWO};
  static const int kBottom[] = {BN_RAND_BOTTOM_ANY, BN_RAND_BOTTOM_ODD};
  for (unsigned bits = 0; bits < 256; bits++) {
    SCOPED_TRACE(bits);
    for (int top : kTop) {
      SCOPED_TRACE(top);
      for (int bottom : kBottom) {
        SCOPED_TRACE(bottom);

        // Generate 100 numbers and ensure that they have the expected bit
        // patterns. The probability of any one bit not covering both its values
        // is 2^-100.
        bool seen_n_1_clear = false, seen_n_1_set = false;
        bool seen_n_2_clear = false, seen_n_2_set = false;
        bool seen_0_clear = false, seen_0_set = false;
        for (int i = 0; i < 100; i++) {
          ASSERT_TRUE(BN_rand(bn.get(), bits, top, bottom));
          EXPECT_LE(BN_num_bits(bn.get()), bits);
          if (BN_is_bit_set(bn.get(), bits - 1)) {
            seen_n_1_set = true;
          } else {
            seen_n_1_clear = true;
          }
          if (BN_is_bit_set(bn.get(), bits - 2)) {
            seen_n_2_set = true;
          } else {
            seen_n_2_clear = true;
          }
          if (BN_is_bit_set(bn.get(), 0)) {
            seen_0_set = true;
          } else {
            seen_0_clear = true;
          }
        }

        if (bits > 0) {
          EXPECT_TRUE(seen_0_set);
          EXPECT_TRUE(seen_n_1_set);
          if (bits > 1) {
            EXPECT_TRUE(seen_n_2_set);
          }
        }

        if (bits == 0) {
          // Nothing additional to check. The |BN_num_bits| check ensures we
          // always got zero.
        } else if (bits == 1) {
          // Bit zero is bit n-1.
          EXPECT_EQ(bottom == BN_RAND_BOTTOM_ANY && top == BN_RAND_TOP_ANY,
                    seen_0_clear);
        } else if (bits == 2) {
          // Bit zero is bit n-2.
          EXPECT_EQ(bottom == BN_RAND_BOTTOM_ANY && top != BN_RAND_TOP_TWO,
                    seen_0_clear);
          EXPECT_EQ(top == BN_RAND_TOP_ANY, seen_n_1_clear);
        } else {
          EXPECT_EQ(bottom == BN_RAND_BOTTOM_ANY, seen_0_clear);
          EXPECT_EQ(top != BN_RAND_TOP_TWO, seen_n_2_clear);
          EXPECT_EQ(top == BN_RAND_TOP_ANY, seen_n_1_clear);
        }
      }
    }
  }
}